

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlib.c
# Opt level: O1

void cxpose(float *indata,long iRsiz,float *outdata,long oRsiz,long Nrows,long Ncols)

{
  bool bVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (3 < Nrows) {
    pfVar5 = outdata + 6;
    uVar6 = (ulong)Nrows >> 2;
    do {
      pfVar3 = pfVar5;
      pfVar4 = indata;
      lVar7 = Ncols + 1;
      if (0 < Ncols) {
        do {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)pfVar4;
          auVar8 = vmovhps_avx(auVar8,*(undefined8 *)(pfVar4 + iRsiz * 2));
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(pfVar4 + iRsiz * 4);
          auVar9 = vmovhps_avx(auVar9,*(undefined8 *)(pfVar4 + iRsiz * 6));
          *(undefined1 (*) [16])(pfVar3 + -6) = auVar8;
          *(undefined1 (*) [16])(pfVar3 + -2) = auVar9;
          lVar7 = lVar7 + -1;
          pfVar3 = pfVar3 + oRsiz * 2;
          pfVar4 = pfVar4 + 2;
        } while (1 < lVar7);
      }
      indata = indata + iRsiz * 8;
      outdata = outdata + 8;
      pfVar5 = pfVar5 + 8;
      bVar1 = 1 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar1);
  }
  lVar7 = Nrows % 4;
  if (0 < Ncols && lVar7 != 0) {
    do {
      lVar2 = lVar7 + 1;
      pfVar5 = indata;
      pfVar3 = outdata;
      if (0 < lVar7) {
        do {
          *(ulong *)pfVar3 = *(ulong *)pfVar5;
          lVar2 = lVar2 + -1;
          pfVar5 = pfVar5 + iRsiz * 2;
          pfVar3 = pfVar3 + 2;
        } while (1 < lVar2);
      }
      indata = indata + 2;
      outdata = outdata + oRsiz * 2;
      bVar1 = 1 < Ncols;
      Ncols = Ncols + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void cxpose(float *indata, long iRsiz, float *outdata, long oRsiz, long Nrows, long Ncols){
/* not in-place complex float matrix transpose	*/
/* INPUTS */
/* *indata = input data array	*/
/* iRsiz = offset to between rows of input data array	*/
/* oRsiz = offset to between rows of output data array	*/
/* Nrows = number of rows in input data array	*/
/* Ncols = number of columns in input data array	*/
/* OUTPUTS */
/* *outdata = output data array	*/

float	*irow; 		/* pointer to input row start */
float	*ocol; 		/* pointer to output col start */
float	*idata; 	/* pointer to input data */
float	*odata; 	/* pointer to output data */
long 	RowCnt;		/* row counter */
long 	ColCnt;		/* col counter */
float	T0r; 		/* data storage */
float	T0i; 		/* data storage */
float	T1r; 		/* data storage */
float	T1i; 		/* data storage */
float	T2r; 		/* data storage */
float	T2i; 		/* data storage */
float	T3r; 		/* data storage */
float	T3i; 		/* data storage */
const long inRsizd1 = 2*iRsiz;
const long inRsizd1i = 2*iRsiz + 1;
const long inRsizd2 = 4*iRsiz;
const long inRsizd2i = 4*iRsiz + 1;
const long inRsizd3 = inRsizd2+inRsizd1;
const long inRsizd3i = inRsizd2+inRsizd1 + 1;
const long inRsizd4 = 8*iRsiz;

ocol = outdata;
irow = indata;
for (RowCnt=Nrows/4; RowCnt>0; RowCnt--){
	idata = irow;
	odata = ocol;
	for (ColCnt=Ncols; ColCnt>0; ColCnt--){
		T0r = *idata;
		T0i = *(idata +1);
		T1r = *(idata+inRsizd1);
		T1i = *(idata+inRsizd1i);
		T2r = *(idata+inRsizd2);
		T2i = *(idata+inRsizd2i);
		T3r = *(idata+inRsizd3);
		T3i = *(idata+inRsizd3i);
		*odata = T0r;
		*(odata+1) = T0i;
		*(odata+2) = T1r;
		*(odata+3) = T1i;
		*(odata+4) = T2r;
		*(odata+5) = T2i;
		*(odata+6) = T3r;
		*(odata+7) = T3i;
		idata+=2;
		odata += 2*oRsiz;
	}
	irow += inRsizd4;
	ocol += 8;
}
if (Nrows%4 != 0){
	for (ColCnt=Ncols; ColCnt>0; ColCnt--){
		idata = irow;
		odata = ocol;
		for (RowCnt=Nrows%4; RowCnt>0; RowCnt--){
			T0r = *idata;
			T0i = *(idata+1);
			*odata = T0r;
			*(odata+1) = T0i;
			odata+=2;
			idata += 2*iRsiz;
		}
		irow+=2;
		ocol += 2*oRsiz;
	}
}
}